

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::DynamicLinearAllocator::DynamicLinearAllocator
          (DynamicLinearAllocator *this,IMemoryAllocator *Allocator,Uint32 BlockSize)

{
  bool bVar1;
  Char *Message;
  char (*in_R8) [22];
  undefined1 local_50 [8];
  string msg;
  uint local_1c;
  IMemoryAllocator *pIStack_18;
  Uint32 BlockSize_local;
  IMemoryAllocator *Allocator_local;
  DynamicLinearAllocator *this_local;
  
  local_1c = BlockSize;
  pIStack_18 = Allocator;
  Allocator_local = (IMemoryAllocator *)this;
  std::
  vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ::vector(&this->m_Blocks);
  this->m_BlockSize = local_1c;
  this->m_pAllocator = pIStack_18;
  bVar1 = IsPowerOfTwo<unsigned_int>(local_1c);
  if (!bVar1) {
    FormatString<char[13],unsigned_int,char[22]>
              ((string *)local_50,(Diligent *)"Block size (",(char (*) [13])&local_1c,
               (uint *)") is not power of two",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DynamicLinearAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
               ,0x3c);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

explicit DynamicLinearAllocator(IMemoryAllocator& Allocator, Uint32 BlockSize = 4 << 10) :
        m_BlockSize{BlockSize},
        m_pAllocator{&Allocator}
    {
        VERIFY(IsPowerOfTwo(BlockSize), "Block size (", BlockSize, ") is not power of two");
    }